

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskUtil.cpp
# Opt level: O1

string * ChecksumName_abi_cxx11_
                   (string *__return_storage_ptr__,
                   set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                   *methods)

{
  bool bVar1;
  _Base_ptr p_Var2;
  long lVar3;
  char *pcVar4;
  _Rb_tree_header *p_Var5;
  stringstream ss;
  stringstream asStack_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  p_Var2 = (methods->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(methods->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var5) {
    bVar1 = true;
    do {
      if (!bVar1) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"|",1);
      }
      switch(p_Var2[1]._M_color) {
      case _S_red:
        lVar3 = 4;
        pcVar4 = "None";
        break;
      case _S_black:
        lVar3 = 0xd;
        pcVar4 = "Constant_8C15";
        break;
      case 2:
        lVar3 = 3;
        pcVar4 = "Sum";
        break;
      case 3:
        lVar3 = 3;
        pcVar4 = "XOR";
        break;
      case 4:
        lVar3 = 8;
        pcVar4 = "XOR_18A0";
        break;
      case 5:
        lVar3 = 8;
        pcVar4 = "CRC_D2F6";
        break;
      case 6:
        lVar3 = 0xd;
        pcVar4 = "CRC_D2F6_1802";
        break;
      default:
        goto switchD_00159e68_default;
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar4,lVar3);
switchD_00159e68_default:
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      bVar1 = false;
    } while ((_Rb_tree_header *)p_Var2 != p_Var5);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string ChecksumName(std::set<ChecksumType> methods)
{
    std::stringstream ss;
    bool first = true;

    for (auto& m : methods)
    {
        if (!first)
            ss << "|";
        first = false;

        switch (m)
        {
        case ChecksumType::None:            ss << "None"; break;
        case ChecksumType::Constant_8C15:   ss << "Constant_8C15"; break;
        case ChecksumType::Sum_1800:        ss << "Sum"; break;
        case ChecksumType::XOR_1800:        ss << "XOR"; break;
        case ChecksumType::XOR_18A0:        ss << "XOR_18A0"; break;
        case ChecksumType::CRC_D2F6_1800:   ss << "CRC_D2F6"; break;
        case ChecksumType::CRC_D2F6_1802:   ss << "CRC_D2F6_1802"; break;
        }
    }

    return ss.str();
}